

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celf.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELF::celfalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
              Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
              CascadeModel model)

{
  _Head_base<0UL,_unsigned_long,_false> *__x;
  double dVar1;
  clock_t cVar2;
  ostream *poVar3;
  clock_t cVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  ulong uVar7;
  double local_280;
  double local_270;
  tuple<unsigned_long,_double,_double,_unsigned_long> u;
  double local_240;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_UC;
  vector<unsigned_long,_std::allocator<unsigned_long>_> S_CB;
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_CB;
  deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  Q_UC;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  undefined1 local_138 [16];
  _Elt_pointer ptStack_128;
  _Map_pointer local_120;
  undefined1 local_118 [16];
  _Elt_pointer ptStack_108;
  _Map_pointer local_100;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  _Elt_pointer local_88;
  _Map_pointer pptStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  _Elt_pointer local_48;
  _Map_pointer pptStack_40;
  
  S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::_Deque_base(&Q_UC.
                 super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               );
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::_Deque_base(&Q_CB.
                 super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
               );
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&vecSeed,1,(allocator_type *)&u);
  cVar2 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,"Initial deque start");
  std::endl<char,std::char_traits<char>>(poVar3);
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(graph->
                             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(graph->
                            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1)
  {
    *vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = uVar7;
    dVar1 = GraphBase::inf_eval(graph,&vecSeed,model,10000);
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar7];
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)0;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = dVar1;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar7;
    std::
    deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
    ::emplace_back<std::tuple<unsigned_long,double,double,unsigned_long>>
              ((deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
                *)&Q_UC,&u);
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar7];
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)0;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = dVar1 / u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                           super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                           super__Tuple_impl<2UL,_double,_unsigned_long>.
                           super__Head_base<2UL,_double,_false>._M_head_impl;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar7;
    std::
    deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
    ::emplace_back<std::tuple<unsigned_long,double,double,unsigned_long>>
              ((deque<std::tuple<unsigned_long,double,double,unsigned_long>,std::allocator<std::tuple<unsigned_long,double,double,unsigned_long>>>
                *)&Q_CB,&u);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Initial deque end");
  std::endl<char,std::char_traits<char>>(poVar3);
  cVar4 = clock();
  poVar3 = std::ostream::_M_insert<double>((double)((cVar4 - cVar2) / 1000000));
  poVar3 = std::operator<<(poVar3," s");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_58 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_;
  uStack_54 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_;
  uStack_50 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first._0_4_;
  uStack_4c = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_;
  local_48 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  pptStack_40 = Q_UC.
                super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_78 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_;
  uStack_74 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_;
  uStack_70 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._0_4_;
  uStack_6c = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._4_4_;
  local_68 = Q_UC.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
  uStack_64 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
  uStack_60 = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
  uStack_5c = Q_UC.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>
            ();
  local_98 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_;
  uStack_94 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_;
  uStack_90 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first._0_4_;
  uStack_8c = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_first._4_4_;
  local_88 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  pptStack_80 = Q_CB.
                super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_b8 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_;
  uStack_b4 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_;
  uStack_b0 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._0_4_;
  uStack_ac = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first._4_4_;
  local_a8 = Q_CB.
             super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
  uStack_a4 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
  uStack_a0 = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
  uStack_9c = Q_CB.
              super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
  std::
  sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>
            ();
  poVar3 = std::operator<<((ostream *)&std::cout,"Start UC");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_280 = 0.0;
  __x = &u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
         super__Head_base<0UL,_unsigned_long,_false>;
  local_270 = 0.0;
  while (local_280 < budget) {
    puVar5 = (unsigned_long *)
             CONCAT44(Q_UC.
                      super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                      Q_UC.
                      super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_);
    do {
      if ((double)puVar5[1] + local_280 <= budget) {
        puVar6 = (unsigned_long *)
                 CONCAT44(Q_UC.
                          super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                          Q_UC.
                          super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
        break;
      }
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front(&Q_UC);
      puVar5 = (unsigned_long *)
               CONCAT44(Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                        Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_);
      puVar6 = (unsigned_long *)
               CONCAT44(Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                        Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
    } while (puVar6 != puVar5);
    if (puVar6 == puVar5) break;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)*puVar5;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (double)puVar5[1];
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)puVar5[2];
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = puVar5[3];
    if (u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
        super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
        super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
        super__Head_base<3UL,_unsigned_long,_false>._M_head_impl ==
        (_Head_base<3UL,_unsigned_long,_false>)
        ((long)S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&S_UC,&__x->_M_head_impl);
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front(&Q_UC);
      local_280 = local_280 +
                  u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                  super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                  super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>
                  ._M_head_impl;
      local_270 = GraphBase::inf_eval(graph,&S_UC,model,10000);
      poVar3 = std::operator<<((ostream *)&std::cout,"UC push new seed: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," ");
      dVar1 = sum_budget(budget_list,&S_UC);
      poVar3 = std::ostream::_M_insert<double>(dVar1);
      std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<double>(local_270);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&S_UC,&__x->_M_head_impl);
      dVar1 = GraphBase::inf_eval(graph,&S_UC,model,10000);
      ((long *)CONCAT44(Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                        Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_))[2] =
           (long)(dVar1 - local_270);
      S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      *(long *)CONCAT44(Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                        Q_UC.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_) =
           (long)S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
      ptStack_108 = Q_UC.
                    super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_100 = Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_c8 = Q_UC.
                 super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
      uStack_c4 = Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
      uStack_c0 = Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
      uStack_bc = Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>
                (local_118,local_d8);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"End UC");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Start CB");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_280 = 0.0;
  this = &S_CB;
  local_240 = 0.0;
  while (local_280 < budget) {
    puVar5 = (unsigned_long *)
             CONCAT44(Q_CB.
                      super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                      Q_CB.
                      super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_);
    do {
      if ((double)puVar5[1] + local_280 <= budget) {
        puVar6 = (unsigned_long *)
                 CONCAT44(Q_CB.
                          super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                          Q_CB.
                          super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
        break;
      }
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front(&Q_CB);
      puVar5 = (unsigned_long *)
               CONCAT44(Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                        Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_);
      puVar6 = (unsigned_long *)
               CONCAT44(Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_,
                        Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_);
    } while (puVar6 != puVar5);
    if (puVar6 == puVar5) break;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
    super__Head_base<3UL,_unsigned_long,_false>._M_head_impl =
         (_Head_base<3UL,_unsigned_long,_false>)*puVar5;
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
    super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>._M_head_impl
         = (double)puVar5[1];
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Tuple_impl<1UL,_double,_double,_unsigned_long>.super__Head_base<1UL,_double,_false>.
    _M_head_impl = (double)puVar5[2];
    u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = puVar5[3];
    if (u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
        super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
        super__Tuple_impl<2UL,_double,_unsigned_long>.super__Tuple_impl<3UL,_unsigned_long>.
        super__Head_base<3UL,_unsigned_long,_false>._M_head_impl ==
        (_Head_base<3UL,_unsigned_long,_false>)
        ((long)S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (this,&u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      std::
      deque<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
      ::pop_front(&Q_CB);
      local_280 = local_280 +
                  u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                  super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                  super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>
                  ._M_head_impl;
      local_240 = GraphBase::inf_eval(graph,this,model,10000);
      poVar3 = std::operator<<((ostream *)&std::cout,"CB push new seed: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," ");
      dVar1 = sum_budget(budget_list,this);
      poVar3 = std::ostream::_M_insert<double>(dVar1);
      std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<double>(local_240);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (this,&u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      dVar1 = GraphBase::inf_eval(graph,this,model,10000);
      ((long *)CONCAT44(Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                        Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_))[2] =
           (long)((dVar1 - local_240) /
                 u.super__Tuple_impl<0UL,_unsigned_long,_double,_double,_unsigned_long>.
                 super__Tuple_impl<1UL,_double,_double,_unsigned_long>.
                 super__Tuple_impl<2UL,_double,_unsigned_long>.super__Head_base<2UL,_double,_false>.
                 _M_head_impl);
      S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      *(long *)CONCAT44(Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                        Q_CB.
                        super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_) =
           (long)S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
      ptStack_128 = Q_CB.
                    super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_120 = Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_e8 = Q_CB.
                 super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
      uStack_e4 = Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
      uStack_e0 = Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
      uStack_dc = Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
      std::
      sort<std::_Deque_iterator<std::tuple<unsigned_long,double,double,unsigned_long>,std::tuple<unsigned_long,double,double,unsigned_long>&,std::tuple<unsigned_long,double,double,unsigned_long>*>,CELF::celfalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>
                (local_138,local_f8);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"CB end");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (local_240 <= local_270) {
    std::operator<<((ostream *)&std::cout,"UC_inf: ");
    poVar3 = std::ostream::_M_insert<double>(local_270);
    std::endl<char,std::char_traits<char>>(poVar3);
    this = &S_UC;
  }
  else {
    std::operator<<((ostream *)&std::cout,"CB_inf: ");
    poVar3 = std::ostream::_M_insert<double>(local_240);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start =
       (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vecSeed.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~_Deque_base(&Q_CB.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                );
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
  ::~_Deque_base(&Q_UC.
                  super__Deque_base<std::tuple<unsigned_long,_double,_double,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_double,_double,_unsigned_long>_>_>
                );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&S_CB.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&S_UC.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<size_t> celfalgo(const Graph& graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        std::deque<std::tuple<size_t, double, double, size_t>> Q_UC;  // u u.mg u.cost u.iter
        std::deque<std::tuple<size_t, double, double, size_t>> Q_CB;  // u u.mg/u.cost u.cost u.iter

        std::vector<size_t> vecSeed(1);

        clock_t startTime, endTime;
        startTime = clock();
        std::cout << "Initial deque start" << std::endl;
        for (size_t i = 0; i < graph.size(); i++){
            vecSeed[0] = i;
            double mg = GraphBase::inf_eval(graph, vecSeed, model);
            Q_UC.push_back(std::make_tuple(i, mg, budget_list[i], 0));
            Q_CB.push_back(std::make_tuple(i, mg / budget_list[i], budget_list[i], 0));
        }
        std::cout << "Initial deque end" << std::endl;
        endTime = clock();
        std::cout << double((endTime - startTime) / CLOCKS_PER_SEC) << " s" << std::endl;

        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<2>(left) < std::get<2>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        std::cout << "Start UC" << std::endl;
        double budget_UC = 0;
        double S_UC_inf = 0;
        while(budget_UC < budget) {
            while(std::get<2>(Q_UC.front()) + budget_UC > budget){  // u u.mg u.cost u.iter
                Q_UC.pop_front();
                if(Q_UC.empty()){
                    break;
                }
            }
            if(Q_UC.empty()){
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_UC.front();  // u u.mg u.cost u.iter
            if(std::get<3>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<2>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<3>(Q_UC.front()) = S_UC.size();
                std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "End UC" << std::endl;

        std::cout << "Start CB" << std::endl;
        double budget_CB = 0;
        double S_CB_inf = 0;
        while(budget_CB < budget) {
            while(std::get<2>(Q_CB.front()) + budget_CB > budget){
                Q_CB.pop_front();
                if(Q_CB.empty()){
                    break;
                }
            }
            if(Q_CB.empty()) {
                break;
            }
            std::tuple<size_t, double, double, size_t> u = Q_CB.front();  // u u.mg/u.cost u.cost u.iter
            if(std::get<3>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<2>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                std::cout << "CB push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<2>(u);
                S_CB.pop_back();
                std::get<3>(Q_CB.front()) = S_CB.size();
                std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                    if (std::get<1>(left) == std::get<1>(right)) {
                        return std::get<2>(left) < std::get<2>(right);
                    }
                    else {
                        return std::get<1>(left) > std::get<1>(right);
                    }
                });
            }
        }
        std::cout << "CB end" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }